

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall ObjectTest_basic_set_vector_Test::TestBody(ObjectTest_basic_set_vector_Test *this)

{
  char *pcVar1;
  object obj;
  AssertHelper local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_f8 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_f0;
  pointer local_e8;
  ulong uStack_e0;
  _Bit_pointer local_d8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_c0;
  pointer local_b8;
  undefined8 uStack_b0;
  _Bit_pointer local_a8;
  undefined1 local_98 [16];
  pointer local_88;
  undefined8 uStack_80;
  _Bit_pointer local_78;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_68;
  char local_38;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_68._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_38 = '\0';
  local_d8 = (_Bit_pointer)0x0;
  local_e8 = (pointer)0x0;
  uStack_e0 = 0;
  local_f8 = (undefined1  [8])0x0;
  _Stack_f0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  jessilib::object::set<std::vector<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)&local_68._M_first,(vector<bool,_std::allocator<bool>_> *)local_f8);
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_d8 - (long)local_f8);
  }
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<bool> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20a,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_b8 = (pointer)0x0;
  uStack_b0._0_4_ = 0;
  uStack_b0._4_4_ = 0;
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8 = (_Bit_pointer)0x0;
  jessilib::object::
  get<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_nullptr>
            ((vector<bool,_std::allocator<bool>_> *)local_f8,(object *)&local_68._M_first,
             (vector<bool,_std::allocator<bool>_> *)local_c8);
  local_88 = (pointer)0x0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 0;
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_78 = (_Bit_pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
            (local_28,"obj .get< std::vector<bool> >()","std::vector<bool> {}",
             (vector<bool,_std::allocator<bool>_> *)local_f8,
             (vector<bool,_std::allocator<bool>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_78 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_d8 - (long)local_f8);
    local_f8 = (undefined1  [8])0x0;
    _Stack_f0._M_head_impl = _Stack_f0._M_head_impl & 0xffffffff00000000;
    local_e8 = (pointer)0x0;
    uStack_e0 = uStack_e0 & 0xffffffff00000000;
    local_d8 = (_Bit_pointer)0x0;
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_a8 - (long)local_c8);
    local_c8 = (undefined1  [8])0x0;
    pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)pbStack_c0 & 0xffffffff00000000);
    local_b8 = (pointer)0x0;
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
              *)local_f8,
             (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
              *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<signed char> >()","false"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20b,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_f8,
             (object *)&local_68._M_first,
             (vector<signed_char,_std::allocator<signed_char>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<signed_char,std::allocator<signed_char>>,std::vector<signed_char,std::allocator<signed_char>>>
            ((internal *)local_108,"obj .get< std::vector<signed char> >()",
             "std::vector<signed char> {}",
             (vector<signed_char,_std::allocator<signed_char>_> *)local_f8,
             (vector<signed_char,_std::allocator<signed_char>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_f8,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<unsigned char> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20c,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,
             (object *)&local_68._M_first,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)local_108,"obj .get< std::vector<unsigned char> >()",
             "std::vector<unsigned char> {}",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> *)local_f8,
             (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<short> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20d,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<short,_std::allocator<short>_>,_std::vector<short,_std::allocator<short>_>,_nullptr>
            ((vector<short,_std::allocator<short>_> *)local_f8,(object *)&local_68._M_first,
             (vector<short,_std::allocator<short>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<short,std::allocator<short>>,std::vector<short,std::allocator<short>>>
            ((internal *)local_108,"obj .get< std::vector<short> >()","std::vector<short> {}",
             (vector<short,_std::allocator<short>_> *)local_f8,
             (vector<short,_std::allocator<short>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)local_f8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<int> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20e,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((vector<int,_std::allocator<int>_> *)local_f8,(object *)&local_68._M_first,
             (vector<int,_std::allocator<int>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)local_108,"obj .get< std::vector<int> >()","std::vector<int> {}",
             (vector<int,_std::allocator<int>_> *)local_f8,
             (vector<int,_std::allocator<int>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)local_f8,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20f,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>,_nullptr>
            ((vector<long,_std::allocator<long>_> *)local_f8,(object *)&local_68._M_first,
             (vector<long,_std::allocator<long>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<long,std::allocator<long>>,std::vector<long,std::allocator<long>>>
            ((internal *)local_108,"obj .get< std::vector<long> >()","std::vector<long> {}",
             (vector<long,_std::allocator<long>_> *)local_f8,
             (vector<long,_std::allocator<long>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x20f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> *)
             local_f8,(__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                       *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<long long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x210,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<long_long,_std::allocator<long_long>_>,_std::vector<long_long,_std::allocator<long_long>_>,_nullptr>
            ((vector<long_long,_std::allocator<long_long>_> *)local_f8,(object *)&local_68._M_first,
             (vector<long_long,_std::allocator<long_long>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((internal *)local_108,"obj .get< std::vector<long long> >()",
             "std::vector<long long> {}",(vector<long_long,_std::allocator<long_long>_> *)local_f8,
             (vector<long_long,_std::allocator<long_long>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x210,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)local_f8,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<intmax_t> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x211,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>,_nullptr>
            ((vector<long,_std::allocator<long>_> *)local_f8,(object *)&local_68._M_first,
             (vector<long,_std::allocator<long>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<long,std::allocator<long>>,std::vector<long,std::allocator<long>>>
            ((internal *)local_108,"obj .get< std::vector<intmax_t> >()","std::vector<intmax_t> {}",
             (vector<long,_std::allocator<long>_> *)local_f8,
             (vector<long,_std::allocator<long>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x211,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)local_f8,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<float> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x212,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<float,_std::allocator<float>_>,_std::vector<float,_std::allocator<float>_>,_nullptr>
            ((vector<float,_std::allocator<float>_> *)local_f8,(object *)&local_68._M_first,
             (vector<float,_std::allocator<float>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
            ((internal *)local_108,"obj .get< std::vector<float> >()","std::vector<float> {}",
             (vector<float,_std::allocator<float>_> *)local_f8,
             (vector<float,_std::allocator<float>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x212,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)local_f8,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)local_c8)
  ;
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x213,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>,_nullptr>
            ((vector<double,_std::allocator<double>_> *)local_f8,(object *)&local_68._M_first,
             (vector<double,_std::allocator<double>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
            ((internal *)local_108,"obj .get< std::vector<double> >()","std::vector<double> {}",
             (vector<double,_std::allocator<double>_> *)local_f8,
             (vector<double,_std::allocator<double>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x213,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
              *)local_f8,
             (__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
              *)local_c8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<long double> >()","false"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x214,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<long_double,_std::allocator<long_double>_>,_std::vector<long_double,_std::allocator<long_double>_>,_nullptr>
            ((vector<long_double,_std::allocator<long_double>_> *)local_f8,
             (object *)&local_68._M_first,
             (vector<long_double,_std::allocator<long_double>_> *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<long_double,std::allocator<long_double>>,std::vector<long_double,std::allocator<long_double>>>
            ((internal *)local_108,"obj .get< std::vector<long double> >()",
             "std::vector<long double> {}",
             (vector<long_double,_std::allocator<long_double>_> *)local_f8,
             (vector<long_double,_std::allocator<long_double>_> *)local_98);
  if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
      != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x214,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [8])0x0;
  _Stack_f0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8 = (undefined1  [8])0x0;
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,__gnu_cxx::__normal_iterator<std::__cxx11::u8string*,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::u8string*,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (__normal_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_*,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>_>
              *)local_c8,
             (__normal_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_*,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>_>
              *)local_98);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)local_f8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<std::u8string> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x215,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  jessilib::object::
  get<std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_f8,(object *)&local_68._M_first,
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_c8);
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_108,"obj .get< std::vector<std::u8string> >()",
             "std::vector<std::u8string> {}",
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_f8,
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_98);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)local_98);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)local_c8);
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x215,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_f8 = (undefined1  [8])0x0;
  _Stack_f0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8 = (pointer)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_f8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_f8);
  local_c8[0] = local_38 == '\x06';
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_f8,local_c8,"obj .has< std::vector<object> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x216,(char *)local_f8);
    testing::internal::AssertHelper::operator=(local_108,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_f8 != (undefined1  [8])&local_e8) {
      operator_delete((void *)local_f8,(ulong)((long)&(local_e8->_M_dataplus)._M_p + 1));
    }
    if ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98._0_8_
        != (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0) {
      (**(code **)(((_Alloc_hider *)local_98._0_8_)->_M_p + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (pointer)0x0;
  if (local_38 == '\x06') {
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
              ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_f8,
               (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_68._M_first);
  }
  else {
    local_f8 = (undefined1  [8])0x0;
    _Stack_f0._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_e8 = (pointer)0x0;
    local_c8 = (undefined1  [8])0x0;
    pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_b8 = (pointer)0x0;
  }
  local_98._0_8_ = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)0x0
  ;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (pointer)0x0;
  testing::internal::
  CmpHelperEQ<std::vector<jessilib::object,std::allocator<jessilib::object>>,std::vector<jessilib::object,std::allocator<jessilib::object>>>
            ((internal *)local_108,"obj .get< std::vector<object> >()","std::vector<object> {}",
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_f8,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_98);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_98);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_f8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_c8);
  if (local_108[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x216,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_f8 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_f8)->_M_string_length)();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_68._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_set_vector) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::vector<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<short>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<int>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<float>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<double>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<object>);
}